

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typesystem_generator.cpp
# Opt level: O2

void __thiscall
franca::TypeDefinitionGenerator::TypeDefinitionGenerator(TypeDefinitionGenerator *this)

{
  karma_rule<fidler::ast::TypeDefinition_()> *this_00;
  string *this_01;
  karma_rule<fidler::ast::ArrayType_()> *this_02;
  karma_rule<fidler::ast::EnumerationType_()> *this_03;
  karma_rule<fidler::ast::StructType_()> *this_04;
  undefined8 uVar1;
  karma_rule<fidler::ast::Field_()> *this_05;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>
  that;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>
  that_1;
  char **local_138;
  TypeGenerator *local_130;
  char *local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  _Alloc_hider local_118;
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_110;
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_f8;
  TypeGenerator *local_f0;
  char *local_e8;
  karma_rule<fidler::ast::UnionType_()> *local_e0;
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  local_d8;
  karma_rule<fidler::ast::EnumerationType_()> *local_90;
  ExpressionGenerator *local_88;
  karma_rule<fidler::ast::TypeDefinition_()> *local_80;
  undefined1 *local_78;
  karma_rule<fidler::ast::Enumerator_()> *local_70;
  char *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  karma_rule<fidler::ast::ArrayType_()> *local_48;
  string *local_40;
  karma_rule<fidler::ast::ArrayType_()> *local_38;
  
  std::__cxx11::string::string((string *)&local_118,"unnamed-grammar",(allocator *)&local_138);
  this_00 = &this->type_definition_;
  (this->super_karma_grammar<fidler::ast::TypeDefinition_()>).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::grammar<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = this_00;
  this_01 = &(this->super_karma_grammar<fidler::ast::TypeDefinition_()>).name_;
  std::__cxx11::string::string((string *)this_01,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  local_40 = this_01;
  std::__cxx11::string::string((string *)&local_118,"unnamed-rule",(allocator *)&local_138);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(this_00,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  local_80 = this_00;
  TypeGenerator::TypeGenerator(&this->type_);
  local_88 = &this->expression_;
  local_d8.f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.functor.members._0_8_ = (undefined8)&this->type_;
  ExpressionGenerator::ExpressionGenerator(local_88);
  std::__cxx11::string::string((string *)&local_118,"unnamed-rule",(allocator *)&local_138);
  this_02 = &this->array_type_;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(this_02,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  local_48 = this_02;
  std::__cxx11::string::string((string *)&local_118,"unnamed-rule",(allocator *)&local_138);
  this_03 = &this->enumeration_type_;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::EnumerationType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(this_03,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  local_90 = this_03;
  std::__cxx11::string::string((string *)&local_118,"unnamed-rule",(allocator *)&local_138);
  this_04 = &this->struct_type_;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::StructType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(this_04,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  local_d8.f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.functor._16_8_ = this_04;
  std::__cxx11::string::string((string *)&local_118,"unnamed-rule",(allocator *)&local_138);
  local_d8.f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)&this->union_type_;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::UnionType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::UnionType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_d8.f.
            super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
            .super_function_base.vtable,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string((string *)&local_118,"unnamed-rule",(allocator *)&local_138);
  local_d8.name_.field_2._8_8_ = &this->map_type_;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::MapType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::MapType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_d8.name_.field_2._8_8_,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string((string *)&local_118,"unnamed-rule",(allocator *)&local_138);
  local_d8.name_.field_2._M_allocated_capacity = (size_type)&this->alias_type_;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::AliasType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::AliasType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_d8.name_.field_2._M_allocated_capacity,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string((string *)&local_118,"unnamed-rule",(allocator *)&local_138);
  local_d8.name_._M_string_length = (size_type)&this->enumerator_;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_d8.name_._M_string_length,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string((string *)&local_118,"unnamed-rule",(allocator *)&local_138);
  this_05 = &this->field_;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Field_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(this_05,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  local_128 = (char *)&local_f8;
  local_e8 = (char *)&local_128;
  local_e0 = (karma_rule<fidler::ast::UnionType_()> *)
             local_d8.f.
             super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
             .super_function_base.vtable;
  local_130 = (TypeGenerator *)local_d8.name_.field_2._8_8_;
  local_110 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)local_d8.name_.field_2._M_allocated_capacity;
  local_138 = &local_e8;
  local_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)this_04;
  local_118._M_p = (pointer)&local_138;
  local_f8 = this_02;
  local_f0 = (TypeGenerator *)this_03;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,boost::variant<fidler::ast::ArrayType,fidler::ast::EnumerationType,fidler::ast::StructType,fidler::ast::UnionType,fidler::ast::MapType,fidler::ast::AliasType>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::ArrayType(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&,boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::EnumerationType(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::StructType(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::UnionType(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::MapType(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::AliasType(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>>
            (local_80,&local_118);
  uVar1 = local_d8.f.
          super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
          .super_function_base.functor.members._0_8_;
  local_128 = "  array ";
  local_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&boost::spirit::standard::string;
  local_e8 = (char *)&local_128;
  local_e0 = (karma_rule<fidler::ast::UnionType_()> *)0x616dce;
  local_130 = (TypeGenerator *)
              local_d8.f.
              super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
              .super_function_base.functor.members._0_8_;
  local_f8._0_1_ = 10;
  local_110 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)&local_f8;
  local_138 = &local_e8;
  local_118._M_p = (pointer)&local_138;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::ArrayType(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[9]>,0l>,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[5]>,0l>>,2l>const&,franca::TypeGenerator&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (this_02);
  local_128 = "  typedef ";
  local_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&boost::spirit::standard::string;
  local_e8 = (char *)&local_128;
  local_e0 = (karma_rule<fidler::ast::UnionType_()> *)0x616dde;
  local_130 = (TypeGenerator *)uVar1;
  local_f8 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)CONCAT71(local_f8._1_7_,10);
  local_110 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)&local_f8;
  local_138 = &local_e8;
  local_118._M_p = (pointer)&local_138;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::AliasType(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[11]>,0l>,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[5]>,0l>>,2l>const&,franca::TypeGenerator&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (local_d8.name_.field_2._M_allocated_capacity);
  local_f8 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)0x616de3;
  local_f0 = (TypeGenerator *)&boost::spirit::standard::string;
  local_d8.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(proto_child0)0x610cf6;
  local_d8.name_._M_dataplus._M_p = &boost::spirit::standard::string;
  local_128 = (char *)&local_f8;
  local_e8 = (char *)&local_128;
  local_e0 = (karma_rule<fidler::ast::UnionType_()> *)0x61cec2;
  local_70 = (karma_rule<fidler::ast::Enumerator_()> *)local_d8.name_._M_string_length;
  local_110 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)0x61cf86;
  local_138 = &local_e8;
  local_130 = (TypeGenerator *)&local_70;
  local_120 = &local_60;
  local_118._M_p = (pointer)&local_138;
  local_60._M_allocated_capacity = (size_type)&local_d8;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::EnumerationType(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[15]>,0l>,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[10]>,0l>,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[6]>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Enumerator(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[5]>,0l>>,2l>>
            (local_90);
  local_d8.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(proto_child0)0x616df2;
  local_d8.name_._M_dataplus._M_p = &boost::spirit::standard::string;
  local_60._M_allocated_capacity = (size_type)" extends ";
  local_60._8_8_ = &boost::spirit::standard::string;
  local_f0 = (TypeGenerator *)&local_50;
  local_78 = (undefined1 *)
             ((long)&local_d8.f.
                     super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
                     .super_function_base.functor + 0xe);
  local_d8.f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.functor.data[0xe] = '\x01';
  local_70 = (karma_rule<fidler::ast::Enumerator_()> *)&local_78;
  local_68 = " polymorphic";
  local_128 = (char *)&local_f8;
  local_e8 = (char *)&local_128;
  local_e0 = (karma_rule<fidler::ast::UnionType_()> *)0x61cec2;
  local_130 = (TypeGenerator *)&local_38;
  local_110 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)0x61cf86;
  local_138 = &local_e8;
  local_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_70;
  local_118._M_p = (pointer)&local_138;
  local_f8 = &local_d8;
  local_50 = &local_60;
  local_38 = (karma_rule<fidler::ast::ArrayType_()> *)this_05;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::StructType(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[10]>,0l>,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift___s_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[5]>,0l>>,2l>>
            (local_d8.f.
             super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
             .super_function_base.functor._16_8_);
  local_f8 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)0x616e09;
  local_f0 = (TypeGenerator *)&boost::spirit::standard::string;
  local_d8.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(proto_child0)0x610cf6;
  local_d8.name_._M_dataplus._M_p = &boost::spirit::standard::string;
  local_128 = (char *)&local_f8;
  local_e8 = (char *)&local_128;
  local_e0 = (karma_rule<fidler::ast::UnionType_()> *)0x61cec2;
  local_110 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)0x61cf86;
  local_138 = &local_e8;
  local_130 = (TypeGenerator *)&local_70;
  local_120 = &local_60;
  local_118._M_p = (pointer)&local_138;
  local_70 = (karma_rule<fidler::ast::Enumerator_()> *)this_05;
  local_60._M_allocated_capacity = (size_type)&local_d8;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::UnionType(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[9]>,0l>,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[10]>,0l>,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[6]>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Field(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[5]>,0l>>,2l>>
            (local_d8.f.
             super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
             .super_function_base.vtable);
  uVar1 = local_d8.f.
          super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
          .super_function_base.functor.members._0_8_;
  local_d8.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(proto_child0)0x616e12;
  local_d8.name_._M_dataplus._M_p = &boost::spirit::standard::string;
  local_f8 = &local_d8;
  local_f0 = (TypeGenerator *)0x616e19;
  local_128 = (char *)&local_f8;
  local_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8.f.
                 super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
                 .super_function_base.functor.members._0_8_;
  local_e8 = (char *)&local_128;
  local_e0 = (karma_rule<fidler::ast::UnionType_()> *)0x616e1d;
  local_130 = (TypeGenerator *)
              local_d8.f.
              super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
              .super_function_base.functor.members._0_8_;
  local_110 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)0x61cf87;
  local_138 = &local_e8;
  local_118._M_p = (pointer)&local_138;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::MapType(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[7]>,0l>,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[4]>,0l>>,2l>const&,franca::TypeGenerator&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[5]>,0l>>,2l>const&,franca::TypeGenerator&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[4]>,0l>>,2l>>
            (local_d8.name_.field_2._8_8_);
  local_f8 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)0x61cf5b;
  local_f0 = (TypeGenerator *)uVar1;
  local_70 = (karma_rule<fidler::ast::Enumerator_()> *)CONCAT71(local_70._1_7_,1);
  local_60._M_allocated_capacity = (size_type)&local_70;
  local_d8.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_60;
  local_d8.name_._M_dataplus._M_p = "[]";
  local_128 = (char *)&local_f8;
  local_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_d8;
  local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)CONCAT71(local_50._1_7_,0x20);
  local_e8 = (char *)&local_128;
  local_e0 = (karma_rule<fidler::ast::UnionType_()> *)&local_50;
  local_130 = (TypeGenerator *)&boost::spirit::standard::string;
  local_78 = (undefined1 *)CONCAT71(local_78._1_7_,10);
  local_110 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)&local_78;
  local_138 = &local_e8;
  local_118._M_p = (pointer)&local_138;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Field(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[5]>,0l>,franca::TypeGenerator&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,boost::fusion::vector<bool>>>,0l>const&>,1l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[3]>,0l>>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (this_05);
  local_e8 = "    ";
  local_e0 = (karma_rule<fidler::ast::UnionType_()> *)&boost::spirit::standard::string;
  local_128 = " = ";
  local_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88;
  local_f8 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)&local_128;
  local_130 = (TypeGenerator *)&local_f8;
  local_d8.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_._0_1_ = 10;
  local_110 = &local_d8;
  local_138 = &local_e8;
  local_118._M_p = (pointer)&local_138;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Enumerator(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[5]>,0l>,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[4]>,0l>,franca::ExpressionGenerator&>,2l>const&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (local_d8.name_._M_string_length);
  return;
}

Assistant:

TypeDefinitionGenerator::TypeDefinitionGenerator() :
		TypeDefinitionGenerator::base_type(type_definition_)
{
	namespace karma = boost::spirit::karma;

	type_definition_
		%= array_type_
		| enumeration_type_
		| struct_type_
		| union_type_
		| map_type_
		| alias_type_
		;

	array_type_
		%= "  array "
		<< karma::string
		<< " of "
		<< type_
		<< '\n'
		;

	alias_type_
		%= "  typedef "
		<< karma::string
		<< " is "
		<< type_
		<< '\n'
		;

	enumeration_type_
		%= "  enumeration "
		<< karma::string
		<< -(" extends " << karma::string)
		<< "\n  {\n"
		<< *enumerator_
		<< "  }\n"
		;

	struct_type_
		%= "  struct "
		<< karma::string
		<< -(" extends " << karma::string)
		<< (!karma::bool_(true) | " polymorphic")
		<< "\n  {\n"
		<< *field_
		<< "  }\n"
		;

	union_type_
		%= "  union "
		<< karma::string
		<< -(" extends " << karma::string)
		<< "\n  {\n"
		<< *field_
		<< "  }\n"
		;

	map_type_
		%= "  map "
		<< karma::string
		<< " { "
		<< type_
		<< " to "
		<< type_
		<< " }\n"
		;

	field_
		%= "    "
		<< type_
		<< (!karma::bool_(true) | "[]")
		<< ' '
		<< karma::string
		<< '\n'
		;

	enumerator_
		%= "    "
		<< karma::string
		<< -(" = " << expression_)
		<< '\n'
		;
}